

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  void *pvVar7;
  RepeatedField<unsigned_int> *pRVar8;
  ulong uVar9;
  char *pcVar10;
  uint32_t *data_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_02;
  uint *puVar12;
  byte *p;
  TcParseTableBase *args;
  TcParseTableBase *pTVar13;
  ulong uVar14;
  long *plVar15;
  uint uVar16;
  Arena *this;
  TcParseTableBase *pTVar17;
  pair<const_char_*,_unsigned_int> pVar18;
  int local_58;
  int local_50;
  int local_40;
  Arena *local_38;
  
  puVar12 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar12 & 3) != 0) {
    AlignFail(puVar12);
  }
  uVar3 = *(ushort *)((long)puVar12 + 10);
  args = (TcParseTableBase *)0x1;
  pvVar7 = MaybeGetSplitBase(msg,true,table);
  plVar15 = (long *)((ulong)*puVar12 + (long)pvVar7);
  if (((ulong)plVar15 & 7) != 0) {
    AlignFail(plVar15);
  }
  ctx_00 = extraout_RDX;
  if ((undefined1 *)*plVar15 == kZeroBuffer) {
    this = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)this & 1) != 0) {
      this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
    }
    if (this == (Arena *)0x0) {
      pRVar8 = (RepeatedField<unsigned_int> *)operator_new(0x10);
      args = (TcParseTableBase *)0x0;
      RepeatedField<unsigned_int>::RepeatedField(pRVar8,(Arena *)0x0);
      ctx_00 = extraout_RDX_02;
    }
    else {
      pvVar7 = Arena::Allocate(this,0x10);
      args = (TcParseTableBase *)&local_38;
      local_38 = this;
      pRVar8 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
               Construct<google::protobuf::Arena*>(pvVar7,(Arena **)args);
      ctx_00 = extraout_RDX_00;
    }
    *plVar15 = (long)pRVar8;
  }
  if ((uVar3 >> 10 & 1) == 0) {
    data_00 = (uint32_t *)0x0;
  }
  else {
    ctx_00 = (ParseContext *)((long)&table->has_bits_offset + (ulong)table->aux_offset);
    data_00 = *(uint32_t **)
               ((ctx_00->super_EpsCopyInputStream).patch_buffer_ +
               (ulong)(ushort)puVar12[2] * 8 + -0x28);
    args = table;
  }
  pRVar8 = (RepeatedField<unsigned_int> *)*plVar15;
  aVar11.data = (ulong)data_00 >> 0x20;
  pTVar17 = (TcParseTableBase *)msg;
  do {
    uVar14 = (ulong)*ptr;
    if ((long)uVar14 < 0) {
      uVar9 = (long)(char)((byte *)ptr)[1] << 7 | 0x7f;
      if ((long)uVar9 < 0) {
        aVar11.data = (long)(char)((byte *)ptr)[2] << 0xe | 0x3fff;
        if ((long)aVar11 < 0) {
          ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[3] << 0x15 | 0x1fffff);
          uVar9 = uVar9 & (ulong)ctx_00;
          if ((long)uVar9 < 0) {
            args = (TcParseTableBase *)0xffffffffffffff80;
            ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[4] << 0x1c | 0xfffffff);
            aVar11.data = aVar11.data & (ulong)ctx_00;
            if ((long)aVar11.data < 0) {
              ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[5] << 0x23 | 0x7ffffffff);
              uVar9 = uVar9 & (ulong)ctx_00;
              if ((long)uVar9 < 0) {
                ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[6] << 0x2a | 0x3ffffffffff);
                aVar11.data = aVar11.data & (ulong)ctx_00;
                if ((long)aVar11 < 0) {
                  ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[7] << 0x31 | 0x1ffffffffffff);
                  uVar9 = uVar9 & (ulong)ctx_00;
                  if ((long)uVar9 < 0) {
                    ctx_00 = (ParseContext *)((ulong)((byte *)ptr)[8] << 0x38 | 0xffffffffffffff);
                    aVar11.data = aVar11.data & (ulong)ctx_00;
                    if ((long)aVar11 < 0) {
                      p = (byte *)ptr + 10;
                      if (((byte *)ptr)[9] != 1) {
                        bVar1 = ((byte *)ptr)[9];
                        ctx_00 = (ParseContext *)CONCAT71((int7)((ulong)ctx_00 >> 8),bVar1);
                        if ((char)bVar1 < '\0') {
                          p = (byte *)0x0;
                          goto LAB_00228c5b;
                        }
                        if ((bVar1 & 1) == 0) {
                          aVar11.data = aVar11.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      p = (byte *)ptr + 9;
                    }
                  }
                  else {
                    p = (byte *)ptr + 8;
                  }
                }
                else {
                  p = (byte *)ptr + 7;
                }
              }
              else {
                p = (byte *)ptr + 6;
              }
            }
            else {
              p = (byte *)ptr + 5;
            }
          }
          else {
            p = (byte *)ptr + 4;
          }
        }
        else {
          p = (byte *)ptr + 3;
        }
        uVar9 = uVar9 & aVar11.data;
      }
      else {
        p = (byte *)ptr + 2;
      }
      uVar14 = uVar14 & uVar9;
    }
    else {
      p = (byte *)ptr + 1;
    }
LAB_00228c5b:
    if (p == (byte *)0x0) {
      iVar6 = 4;
    }
    else {
      uVar16 = (uint)uVar14;
      if ((uVar3 >> 10 & 1) == 0) {
        if ((uVar3 & 0x600) == 0x200) {
          uVar14 = (ulong)(-(uVar16 & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff);
        }
      }
      else {
        if ((uVar3 & 0x600) == 0x600) {
          local_58 = (int)data_00;
          aVar11._1_7_ = (undefined7)((ulong)aVar11 >> 8);
          aVar11.data._0_1_ = local_58 <= (int)uVar16;
          local_40 = (int)((ulong)data_00 >> 0x20);
          bVar5 = (int)uVar16 <= local_40 && local_58 <= (int)uVar16;
        }
        else {
          bVar5 = ValidateEnum(uVar16,data_00);
        }
        if (bVar5 == false) {
          pcVar10 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
          return pcVar10;
        }
      }
      args = (TcParseTableBase *)(uVar14 & 0xffffffff);
      RepeatedField<unsigned_int>::Add(pRVar8,(uint)uVar14);
      pVar18._8_8_ = extraout_RDX_01;
      pVar18.first = (char *)ctx;
      if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
        bVar1 = *p;
        ptr = (char *)(p + 1);
        pTVar17 = (TcParseTableBase *)(ulong)bVar1;
        if ((char)bVar1 < '\0') {
          bVar2 = *ptr;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = extraout_RDX_01;
          pVar18 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
          aVar11.data = (ulong)bVar2 << 7;
          uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          pTVar13 = (TcParseTableBase *)(ulong)uVar16;
          if ((char)bVar2 < '\0') {
            pVar18 = ReadTagFallback((char *)p,uVar16);
            ptr = pVar18.first;
            pTVar17 = (TcParseTableBase *)(ulong)pVar18.second;
            args = pTVar13;
          }
          else {
            ptr = (char *)(p + 2);
            pTVar17 = pTVar13;
          }
        }
        ctx_00 = pVar18._8_8_;
        iVar6 = (uint)((byte *)ptr == (byte *)0x0) << 2;
      }
      else {
        iVar6 = 5;
        ctx_00 = extraout_RDX_01;
      }
    }
    if (iVar6 != 0) {
      if (iVar6 == 4) {
        pcVar10 = Error(msg,(char *)args,ctx_00,(TcFieldData)aVar11,table,hasbits);
        return pcVar10;
      }
      goto LAB_00228e4c;
    }
    local_50 = data.field_0._0_4_;
    if ((int)pTVar17 != local_50) {
LAB_00228e4c:
      if ((ulong)table->has_bits_offset != 0) {
        puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar12 & 3) != 0) {
          AlignFail();
        }
        *puVar12 = *puVar12 | (uint)hasbits;
      }
      return (char *)p;
    }
  } while( true );
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}